

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TexCubeShader::TexCubeShader(TexCubeShader *this,CubeFace face)

{
  ShaderProgramDeclaration *pSVar1;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  FragmentSource local_298;
  allocator<char> local_271;
  string local_270;
  VertexSource local_250;
  allocator<char> local_229;
  string local_228;
  Uniform local_208;
  FragmentOutput local_1e0;
  VertexToFragmentVarying local_1dc;
  allocator<char> local_1d1;
  string local_1d0;
  VertexAttribute local_1b0;
  allocator<char> local_171;
  string local_170;
  VertexAttribute local_150;
  ShaderProgramDeclaration local_128;
  CubeFace local_14;
  TexCubeShader *pTStack_10;
  CubeFace face_local;
  TexCubeShader *this_local;
  
  local_14 = face;
  pTStack_10 = this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"a_position",&local_171);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_150,&local_170,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_128,&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"a_coord",&local_1d1);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1b0,&local_1d0,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1b0);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(&local_1dc,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1dc);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1e0,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"u_sampler0",&local_229);
  sglr::pdec::Uniform::Uniform(&local_208,&local_228,TYPE_SAMPLER_CUBE);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_271);
  sglr::pdec::VertexSource::VertexSource(&local_250,&local_270);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"",&local_319);
  std::operator+(&local_2f8,&local_318,
                 "uniform samplerCube u_sampler0;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tmediump float x = v_coord.x*2.0 - 1.0;\n\tmediump float y = v_coord.y*2.0 - 1.0;\n\tgl_FragColor = textureCube(u_sampler0, "
                );
  std::operator+(&local_2d8,&local_2f8,*(char **)(s_cubeSwizzles + (ulong)local_14 * 8));
  std::operator+(&local_2b8,&local_2d8,");\n}\n");
  sglr::pdec::FragmentSource::FragmentSource(&local_298,&local_2b8);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_298);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::FragmentSource::~FragmentSource(&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  sglr::pdec::VertexSource::~VertexSource(&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  sglr::pdec::Uniform::~Uniform(&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_128);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_0328a640;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_0328a678;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_0328a690;
  *(CubeFace *)&(this->super_ShaderProgram).field_0x154 = local_14;
  return;
}

Assistant:

TexCubeShader (tcu::CubeFace face)
		: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::Uniform("u_sampler0", glu::TYPE_SAMPLER_CUBE)
					<< sglr::pdec::VertexSource("attribute highp vec4 a_position;\n"
												"attribute mediump vec2 a_coord;\n"
												"varying mediump vec2 v_coord;\n"
												"void main (void)\n"
												"{\n"
												"	gl_Position = a_position;\n"
												"	v_coord = a_coord;\n"
												"}\n")
					<< sglr::pdec::FragmentSource(string("") +
												  "uniform samplerCube u_sampler0;\n"
												  "varying mediump vec2 v_coord;\n"
												  "void main (void)\n"
												  "{\n"
												  "	mediump float x = v_coord.x*2.0 - 1.0;\n"
												  "	mediump float y = v_coord.y*2.0 - 1.0;\n"
												  "	gl_FragColor = textureCube(u_sampler0, " + s_cubeSwizzles[face] + ");\n"
												  "}\n"))
		, m_face(face)
	{
	}